

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

bool __thiscall PDFObjectParser::IsNumber(PDFObjectParser *this,string *inToken)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  bool bVar6;
  
  if (inToken->_M_string_length == 0) {
LAB_001a2057:
    bVar4 = false;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
    if (((*pcVar1 != '+') &&
        (pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar1 != '-')) &&
       (pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar1 != '.')) {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
      if ('9' < *pcVar1) {
        return false;
      }
      pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
      if (*pcVar1 < '0') {
        return false;
      }
    }
    pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
    bVar6 = *pcVar1 == '.';
    pcVar5 = (inToken->_M_dataplus)._M_p + 1;
    pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
    if ((*pcVar1 == '+') ||
       (pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar1 == '-')) {
      pcVar3 = (inToken->_M_dataplus)._M_p;
      sVar2 = inToken->_M_string_length;
      if (pcVar5 == pcVar3 + sVar2) goto LAB_001a2057;
    }
    else {
      pcVar3 = (inToken->_M_dataplus)._M_p;
      sVar2 = inToken->_M_string_length;
    }
    bVar4 = true;
    while ((pcVar5 != pcVar3 + sVar2 && (bVar4 != false))) {
      if (*pcVar5 == '.') {
        bVar4 = (bool)(bVar6 ^ 1);
        bVar6 = true;
      }
      else {
        bVar4 = (byte)(*pcVar5 - 0x30U) < 10;
      }
      pcVar5 = pcVar5 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool PDFObjectParser::IsNumber(const std::string& inToken)
{
	if(inToken.size() < 1)
		return false;

	// it's a number if the first char is either a sign or digit, or an initial decimal dot, and the rest is 
	// digits, with the exception of a dot which can appear just once.
	if(inToken.at(0) != scPlus && inToken.at(0) != scMinus && inToken.at(0) != scDot && (inToken.at(0) > scNine || inToken.at(0) < scZero))
		return false;

	bool isNumber = true;
	bool dotEncountered = (inToken.at(0) == scDot);
	std::string::const_iterator it = inToken.begin();
	++it; //verified the first char already

	// only sign is not a number
	if((inToken.at(0) == scPlus || inToken.at(0) == scMinus) && it == inToken.end())
		return false;

	for(; it != inToken.end() && isNumber;++it)
	{
		if(*it == scDot)
		{
			if(dotEncountered)
			{
				isNumber = false;
			}
			dotEncountered = true;
		}
		else
			isNumber = (scZero <= *it && *it <= scNine);
	}
	return isNumber;
}